

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O0

void __thiscall CProfileNode::Reset(CProfileNode *this)

{
  CProfileNode *in_RDI;
  
  in_RDI->TotalCalls = 0;
  in_RDI->TotalTime = 0.0;
  if (in_RDI->Child != (CProfileNode *)0x0) {
    Reset(in_RDI);
  }
  if (in_RDI->Sibling != (CProfileNode *)0x0) {
    Reset(in_RDI);
  }
  return;
}

Assistant:

void	CProfileNode::Reset( void )
{
	TotalCalls = 0;
	TotalTime = 0.0f;


	if ( Child ) {
		Child->Reset();
	}
	if ( Sibling ) {
		Sibling->Reset();
	}
}